

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O2

void __thiscall JetHead::vector<URI::QueryParam>::clear(vector<URI::QueryParam> *this)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < this->mSize; uVar2 = uVar2 + 1) {
    URI::QueryParam::~QueryParam
              ((QueryParam *)((long)&(this->mData->mKey)._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + 0x40;
  }
  this->mSize = 0;
  return;
}

Assistant:

void clear() 
		{ 
			// Call destructor-in-place, not delete (we didn't
			// allocate this object with new).  Destroy everything.
			for (unsigned i = 0; i < mSize; i++)
			{
				mData[i].~T();
			}

			// Nothing is left
			mSize = 0; 
		}